

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  size_type expected_max_items;
  key_equal *eql;
  int iVar2;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  undefined4 in_stack_fffffffffffff4d8;
  int in_stack_fffffffffffff4dc;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4e0;
  char **in_stack_fffffffffffff4e8;
  int index;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4f0;
  key_equal *in_stack_fffffffffffff4f8;
  hasher *in_stack_fffffffffffff500;
  size_type in_stack_fffffffffffff508;
  Type type;
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff510;
  Message *in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  int local_83c;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_830;
  Hasher local_820;
  Hasher local_814 [15];
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_758;
  int local_74c;
  key_equal *local_748;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_740;
  Hasher local_730;
  Hasher local_724 [13];
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_680;
  size_type local_678;
  undefined4 local_66c;
  AssertionResult local_668 [2];
  key_type local_648;
  size_type local_640;
  undefined4 local_634;
  AssertionResult local_630 [2];
  size_type local_610;
  undefined4 local_604;
  AssertionResult local_600 [2];
  size_type local_5e0;
  undefined4 local_5d4;
  AssertionResult local_5d0 [2];
  hasher local_5b0;
  hasher local_5a0;
  int local_590;
  undefined4 local_58c;
  AssertionResult local_588 [2];
  hasher local_568;
  hasher local_558;
  int local_548;
  undefined4 local_544;
  AssertionResult local_540 [2];
  key_type local_520;
  key_type local_518;
  AssertionResult local_510 [2];
  key_type local_4f0;
  key_type local_4e8;
  AssertionResult local_4e0 [2];
  key_type local_4c0;
  size_type local_4b8;
  undefined4 local_4ac;
  AssertionResult local_4a8 [2];
  key_type local_488;
  size_type local_480;
  undefined4 local_474;
  AssertionResult local_470 [2];
  key_type local_450;
  size_type local_448;
  undefined4 local_43c;
  AssertionResult local_438 [2];
  key_type local_418;
  size_type local_410;
  undefined4 local_404;
  AssertionResult local_400 [2];
  key_type local_3e0;
  size_type local_3d8;
  undefined4 local_3cc;
  AssertionResult local_3c8 [2];
  key_type local_3a8;
  size_type local_3a0;
  undefined4 local_394;
  AssertionResult local_390 [2];
  size_type local_370;
  undefined4 local_364;
  AssertionResult local_360 [2];
  size_type local_340;
  undefined4 local_334;
  AssertionResult local_330 [2];
  undefined4 local_30c;
  size_type local_308;
  AssertionResult local_300 [2];
  size_type local_2e0;
  AssertionResult local_2d8 [2];
  key_equal local_2b8;
  key_equal local_2a8;
  int local_298;
  undefined4 local_294;
  AssertionResult local_290 [2];
  key_equal local_270;
  key_equal local_260;
  int local_250;
  undefined4 local_24c;
  AssertionResult local_248 [2];
  hasher local_228;
  hasher local_218;
  int local_208;
  undefined4 local_204;
  AssertionResult local_200 [2];
  hasher local_1e0;
  hasher local_1d0;
  int local_1c0;
  undefined4 local_1bc;
  AssertionResult local_1b8 [2];
  key_type local_198;
  key_type local_190;
  AssertionResult local_188 [2];
  key_type local_168;
  key_type local_160;
  AssertionResult local_158;
  size_type local_148;
  value_type local_118;
  key_type local_110;
  value_type local_e0;
  int local_d4;
  key_type local_d0;
  key_type local_c8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_b0 [9];
  Hasher local_14;
  
  Hasher::Hasher(&local_14,1);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff510,in_stack_fffffffffffff508,in_stack_fffffffffffff500,
             in_stack_fffffffffffff4f8,(allocator_type *)in_stack_fffffffffffff4f0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b0);
  local_c8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff4e0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  local_d0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff4e0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  for (local_d4 = 3; type = (Type)(in_stack_fffffffffffff508 >> 0x20), local_d4 < 2000;
      local_d4 = local_d4 + 1) {
    local_e0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4dc);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (value_type *)in_stack_fffffffffffff558);
  }
  local_110 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffff4e0,
          (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  local_118 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4dc);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
           (value_type *)in_stack_fffffffffffff558);
  local_148 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc07e74);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff4e0,
         (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  local_160 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_168 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc07ee6);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc07f61);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc07fc4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08035);
  local_190 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_198 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc0806e);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc080fb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0815e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc081cf);
  local_1bc = 1;
  local_1e0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff4f0);
  local_1d0 = local_1e0;
  local_1c0 = Hasher::id(&local_1d0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc082bf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc08322);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08393);
  local_204 = 0;
  local_228 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff4f0);
  local_218 = local_228;
  local_208 = Hasher::id(&local_218);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0847f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc084e2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08553);
  local_24c = 1;
  local_270 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff4f0);
  local_260 = local_270;
  local_250 = Hasher::id(&local_260);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc08643);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc086a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08717);
  local_294 = 0;
  local_2b8 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff4f0);
  local_2a8 = local_2b8;
  local_298 = Hasher::id(&local_2a8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc08803);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc08866);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc088d4);
  local_2e0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc088e5);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (unsigned_long *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc08972);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc089d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08a46);
  local_308 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc08a53);
  local_30c = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (unsigned_long *)in_stack_fffffffffffff4e8,(uint *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_300);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc08aeb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc08b4e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08bbf);
  local_334 = 1;
  local_340 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc08bdb);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_330);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc08c68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc08ccb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08d3c);
  local_364 = 0x7cc;
  local_370 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc08d54);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_360);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc08de1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc08e44);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc08eb5);
  local_394 = 0;
  local_3a8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_3a0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_390);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc08f9d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc09000);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc09071);
  local_3cc = 1;
  local_3e0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_3d8 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0914a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc091ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0921e);
  local_404 = 1;
  local_418 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_410 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_400);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc09306);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc09369);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc093da);
  local_43c = 0;
  local_450 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_448 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc094b3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc09516);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc09587);
  local_474 = 0;
  local_488 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_480 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_470);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0966f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc096d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc09743);
  local_4ac = 0;
  local_4c0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_4b8 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0981c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0987f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc098f0);
  google::
  swap<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff4e0,
             (HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  local_4e8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_4f0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc09948);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc099d5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc09a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc09aa9);
  local_518 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_520 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xc09ae2);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             in_stack_fffffffffffff4e8,(char **)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_510);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc09b6f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc09bd2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc09c43);
  local_544 = 0;
  local_568 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff4f0);
  local_558 = local_568;
  local_548 = Hasher::id(&local_558);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_540);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc09d33);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc09d96);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc09e07);
  local_58c = 1;
  local_5b0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff4f0);
  iVar2 = local_5b0.num_compares_;
  local_5a0 = local_5b0;
  local_590 = Hasher::id(&local_5a0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (int *)in_stack_fffffffffffff4e8,(int *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_588);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    in_stack_fffffffffffff558 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0xc09ef3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffff560),in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc09f56);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc09fc7);
  local_5d4 = 0x7cc;
  local_5e0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc09fe3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0a06a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffff560),in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0a0c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0a135);
  local_604 = 1;
  local_610 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc0a14d);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_600);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0a1d4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffff560),in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0a231);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0a2a2);
  local_634 = 1;
  local_648 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20))
  ;
  local_640 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_630);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff510);
    testing::AssertionResult::failure_message((AssertionResult *)0xc0a378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff510,type,(char *)in_stack_fffffffffffff500,
               (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffff560),in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0a3d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0a446);
  local_66c = 0;
  this_00 = (HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20)
                          );
  local_680 = this_00;
  expected_max_items =
       google::
       BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffff4e0,
               (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  local_678 = expected_max_items;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0,
             (uint *)in_stack_fffffffffffff4e8,(unsigned_long *)in_stack_fffffffffffff4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_668);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff500 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xc0a513);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)(expected_max_items >> 0x20),
               (char *)in_stack_fffffffffffff500,(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),
               (char *)in_stack_fffffffffffff4f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_fffffffffffff560),in_stack_fffffffffffff558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4e0);
    testing::Message::~Message((Message *)0xc0a570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc0a5e1);
  Hasher::Hasher(local_724,0);
  Hasher::Hasher(&local_730,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_740,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (this_00,expected_max_items,in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
             (allocator_type *)in_stack_fffffffffffff4f0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_740);
  eql = (key_equal *)
        HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        ::UniqueKey(in_stack_fffffffffffff4f0,(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20));
  local_748 = eql;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff4e0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  for (local_74c = 2; index = (int)((ulong)in_stack_fffffffffffff4e8 >> 0x20), local_74c < 10000;
      local_74c = local_74c + 1) {
    in_stack_fffffffffffff4f0 =
         (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4dc);
    local_758 = in_stack_fffffffffffff4f0;
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(iVar2,in_stack_fffffffffffff560),(value_type *)in_stack_fffffffffffff558);
  }
  Hasher::Hasher(local_814,0);
  Hasher::Hasher(&local_820,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_830,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (this_00,expected_max_items,in_stack_fffffffffffff500,eql,
             (allocator_type *)in_stack_fffffffffffff4f0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_830);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff4e0,
         (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_fffffffffffff4f0,index);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff4e0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8));
  for (local_83c = 2; local_83c < 10000; local_83c = local_83c + 1) {
    in_stack_fffffffffffff4e0 =
         (HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4dc);
    google::
    BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(iVar2,in_stack_fffffffffffff560),(value_type *)in_stack_fffffffffffff558);
  }
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc0a8e0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc0a8ed);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xc0a8fa);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}